

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O3

bool __thiscall
irr::video::CImage::copyToNoScaling
          (CImage *this,void *target,u32 width,u32 height,ECOLOR_FORMAT format,u32 pitch)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  u8 *tgtpos;
  u8 *srcpos;
  u8 *__src;
  
  if (((height == 0 || (width == 0 || target == (void *)0x0)) ||
      ((this->super_IImage).Size.Width == 0)) || ((this->super_IImage).Size.Height == 0)) {
    bVar1 = false;
  }
  else {
    uVar2 = IImage::getBitsPerPixelFromFormat(format);
    uVar3 = (uVar2 >> 3) * width;
    if (pitch == 0) {
      pitch = uVar3;
    }
    bVar1 = false;
    if ((((this->super_IImage).Format == format) && ((this->super_IImage).Size.Width == width)) &&
       ((this->super_IImage).Size.Height == height)) {
      __src = (this->super_IImage).Data;
      if (pitch == (this->super_IImage).Pitch) {
        memcpy(target,__src,(ulong)pitch * (ulong)height);
      }
      else {
        do {
          memcpy(target,__src,(ulong)uVar3);
          memset((void *)((long)target + (ulong)uVar3),0,(ulong)(pitch - uVar3));
          target = (void *)((long)target + (ulong)pitch);
          __src = __src + (this->super_IImage).Pitch;
          height = height - 1;
        } while (height != 0);
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool CImage::copyToNoScaling(void *target, u32 width, u32 height, ECOLOR_FORMAT format, u32 pitch) const
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToNoScaling method doesn't work with compressed images.", ELL_WARNING);
		return false;
	}

	if (!target || !width || !height || !Size.Width || !Size.Height)
		return false;

	const u32 bpp = getBitsPerPixelFromFormat(format) / 8;
	if (0 == pitch)
		pitch = width * bpp;

	if (!(Format == format && Size.Width == width && Size.Height == height))
		return false;

	if (pitch == Pitch) {
		memcpy(target, Data, (size_t)height * pitch);
	} else {
		u8 *tgtpos = (u8 *)target;
		u8 *srcpos = Data;
		const u32 bwidth = width * bpp;
		const u32 rest = pitch - bwidth;
		for (u32 y = 0; y < height; ++y) {
			// copy scanline
			memcpy(tgtpos, srcpos, bwidth);
			// clear pitch
			memset(tgtpos + bwidth, 0, rest);
			tgtpos += pitch;
			srcpos += Pitch;
		}
	}

	return true;
}